

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-itr.c
# Opt level: O0

void rtosc_arg_val_itr_next(rtosc_arg_val_itr *itr)

{
  int32_t iVar1;
  int iVar2;
  long *in_RDI;
  
  if (*(char *)*in_RDI == '-') {
    iVar2 = (int)in_RDI[2] + 1;
    *(int *)(in_RDI + 2) = iVar2;
    iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x10471c);
    if ((iVar1 <= iVar2) && (iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x104733), iVar1 != 0)) {
      iVar1 = rtosc_av_rep_has_delta((rtosc_arg_val_t *)0x104745);
      if (iVar1 != 0) {
        *in_RDI = *in_RDI + 0x18;
        in_RDI[1] = in_RDI[1] + 1;
      }
      *in_RDI = *in_RDI + 0x18;
      in_RDI[1] = in_RDI[1] + 1;
      *(undefined4 *)(in_RDI + 2) = 0;
    }
  }
  if ((int)in_RDI[2] == 0) {
    if (*(char *)*in_RDI == 'a') {
      iVar1 = rtosc_av_arr_len((rtosc_arg_val_t *)0x1047c0);
      in_RDI[1] = (long)iVar1 + in_RDI[1];
      iVar1 = rtosc_av_arr_len((rtosc_arg_val_t *)0x1047dd);
      *in_RDI = *in_RDI + (long)iVar1 * 0x18;
    }
    in_RDI[1] = in_RDI[1] + 1;
    *in_RDI = *in_RDI + 0x18;
  }
  return;
}

Assistant:

void rtosc_arg_val_itr_next(rtosc_arg_val_itr *itr)
{
    // increase the range index
    if(itr->av->type == '-')
    {
        // increase if the limit was reached, and the limit was not infinity (=0)
        if(++itr->range_i >= rtosc_av_rep_num(itr->av) && rtosc_av_rep_num(itr->av))
        {
            if(rtosc_av_rep_has_delta(itr->av))
            {
                ++itr->av;
                ++itr->i;
            }
            ++itr->av;
            ++itr->i;
            itr->range_i = 0;
        }
    }

    // if not inside a range (or at its beginning), increase the index
    if(!itr->range_i)
    {
        if(itr->av->type == 'a')
        {
            itr->i += rtosc_av_arr_len(itr->av);
            itr->av += rtosc_av_arr_len(itr->av);
        }
        ++itr->i;
        ++itr->av;
    }
}